

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::SpreadVolatileSemantics::VisitLoadsOfPointersToVariableInEntries
          (SpreadVolatileSemantics *this,uint32_t var_id,
          function<bool_(spvtools::opt::Instruction_*)> *handle_load,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *function_ids)

{
  uint32_t *puVar1;
  uint32_t id;
  IRContext *this_00;
  uint32_t *puVar2;
  uint32_t *puVar3;
  code *pcVar4;
  bool bVar5;
  _func_void *p_Var6;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar7;
  uint32_t ptr_id;
  uint32_t local_d4;
  uint32_t *local_d0;
  uint32_t *local_c8;
  uint32_t *local_c0;
  DefUseManager *local_b8;
  SpreadVolatileSemantics *local_b0;
  _Any_data *local_a8;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  SpreadVolatileSemantics *local_70;
  uint32_t **ppuStack_68;
  uint32_t *local_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_38;
  
  local_a0 = function_ids;
  local_d0 = (uint32_t *)operator_new(4);
  local_c8 = local_d0 + 1;
  *local_d0 = var_id;
  this_00 = (this->super_Pass).context_;
  local_c0 = local_c8;
  local_b0 = this;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  local_b8 = (this_00->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_a8 = (_Any_data *)handle_load;
  do {
    puVar3 = local_c8;
    puVar2 = local_d0;
    if (local_d0 == local_c8) break;
    puVar1 = local_c8 + -1;
    id = local_c8[-1];
    local_70 = local_b0;
    ppuStack_68 = &local_d0;
    local_60 = &local_d4;
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_d4 = id;
    local_c8 = puVar1;
    if (*(code **)((long)handle_load + 0x10) != (code *)0x0) {
      (**(code **)((long)handle_load + 0x10))(&local_58,(_Any_data *)handle_load,__clone_functor);
      uStack_40 = *(undefined8 *)((long)handle_load + 0x18);
      local_48 = *(code **)((long)handle_load + 0x10);
    }
    pcVar4 = local_48;
    puVar7 = local_a0;
    local_38 = local_a0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_88 = (code *)0x0;
    pcStack_80 = (code *)0x0;
    p_Var6 = (_func_void *)operator_new(0x40);
    *(SpreadVolatileSemantics **)p_Var6 = local_70;
    *(uint32_t ***)(p_Var6 + 8) = ppuStack_68;
    *(uint32_t **)(p_Var6 + 0x10) = local_60;
    *(undefined8 *)(p_Var6 + 0x18) = 0;
    *(undefined8 *)(p_Var6 + 0x20) = 0;
    *(undefined8 *)(p_Var6 + 0x28) = 0;
    *(undefined8 *)(p_Var6 + 0x30) = 0;
    if (pcVar4 != (code *)0x0) {
      (*pcVar4)((_Any_data *)(p_Var6 + 0x18),&local_58,__clone_functor);
      *(code **)(p_Var6 + 0x28) = local_48;
      *(undefined8 *)(p_Var6 + 0x30) = uStack_40;
      puVar7 = local_38;
    }
    *(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      **)(p_Var6 + 0x38) = puVar7;
    pcStack_80 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/spread_volatile_semantics.cpp:213:17)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/spread_volatile_semantics.cpp:213:17)>
               ::_M_manager;
    local_98._M_unused._0_8_ = (undefined8)p_Var6;
    bVar5 = analysis::DefUseManager::WhileEachUser
                      (local_b8,id,(function<bool_(spvtools::opt::Instruction_*)> *)&local_98);
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
    handle_load = (function<bool_(spvtools::opt::Instruction_*)> *)local_a8;
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  } while (bVar5);
  if (local_d0 != (uint32_t *)0x0) {
    operator_delete(local_d0,(long)local_c0 - (long)local_d0);
  }
  return puVar2 == puVar3;
}

Assistant:

bool SpreadVolatileSemantics::VisitLoadsOfPointersToVariableInEntries(
    uint32_t var_id, const std::function<bool(Instruction*)>& handle_load,
    const std::unordered_set<uint32_t>& function_ids) {
  std::vector<uint32_t> worklist({var_id});
  auto* def_use_mgr = context()->get_def_use_mgr();
  while (!worklist.empty()) {
    uint32_t ptr_id = worklist.back();
    worklist.pop_back();
    bool finish_traversal = !def_use_mgr->WhileEachUser(
        ptr_id, [this, &worklist, &ptr_id, handle_load,
                 &function_ids](Instruction* user) {
          BasicBlock* block = context()->get_instr_block(user);
          if (block == nullptr ||
              function_ids.find(block->GetParent()->result_id()) ==
                  function_ids.end()) {
            return true;
          }

          if (user->opcode() == spv::Op::OpAccessChain ||
              user->opcode() == spv::Op::OpInBoundsAccessChain ||
              user->opcode() == spv::Op::OpPtrAccessChain ||
              user->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
              user->opcode() == spv::Op::OpCopyObject) {
            if (ptr_id == user->GetSingleWordInOperand(0))
              worklist.push_back(user->result_id());
            return true;
          }

          if (user->opcode() != spv::Op::OpLoad) {
            return true;
          }

          return handle_load(user);
        });
    if (finish_traversal) return false;
  }
  return true;
}